

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

uint __thiscall
ON_MeshComponentRef::GetMeshTopologyEdgeAndLine
          (ON_MeshComponentRef *this,ON_MeshTopologyEdge **tope,ON_Line *line)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ON_MeshTopology *pOVar4;
  ON_MeshTopologyVertex *pOVar5;
  undefined1 local_68 [8];
  ON_3dPointListRef vlist;
  ON_MeshTopologyVertex *v1;
  ON_MeshTopologyVertex *v0;
  int topv_count;
  ON_MeshTopology *top;
  uint topei;
  ON_Line *line_local;
  ON_MeshTopologyEdge **tope_local;
  ON_MeshComponentRef *this_local;
  
  *tope = (ON_MeshTopologyEdge *)0x0;
  uVar1 = GetMeshTopologyEdge(this,tope);
  if ((((uVar1 != 0xffffffff) && (*tope != (ON_MeshTopologyEdge *)0x0)) &&
      (-1 < (*tope)->m_topvi[0])) &&
     (((-1 < (*tope)->m_topvi[1] && (pOVar4 = MeshTopology(this), pOVar4 != (ON_MeshTopology *)0x0))
      && ((iVar2 = ON_SimpleArray<ON_MeshTopologyVertex>::Count(&pOVar4->m_topv),
          (*tope)->m_topvi[0] < iVar2 && ((*tope)->m_topvi[1] < iVar2)))))) {
    pOVar5 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[](&pOVar4->m_topv,(*tope)->m_topvi[0]);
    vlist.m_fP = (float *)ON_SimpleArray<ON_MeshTopologyVertex>::operator[]
                                    (&pOVar4->m_topv,(*tope)->m_topvi[1]);
    if (((0 < pOVar5->m_v_count) && (0 < ((ON_MeshTopologyVertex *)vlist.m_fP)->m_v_count)) &&
       ((pOVar5->m_vi != (int *)0x0 &&
        ((((((ON_MeshTopologyVertex *)vlist.m_fP)->m_vi != (int *)0x0 && (-1 < *pOVar5->m_vi)) &&
          (-1 < *((ON_MeshTopologyVertex *)vlist.m_fP)->m_vi)) &&
         ((iVar2 = *pOVar5->m_vi,
          iVar3 = ON_SimpleArray<ON_3fPoint>::Count
                            (&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>), iVar2 < iVar3
          && (iVar2 = **(int **)(vlist.m_fP + 6),
             iVar3 = ON_SimpleArray<ON_3fPoint>::Count
                               (&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>),
             iVar2 < iVar3)))))))) {
      ON_3dPointListRef::ON_3dPointListRef((ON_3dPointListRef *)local_68,this->m_mesh);
      ON_3dPointListRef::GetPoint((ON_3dPointListRef *)local_68,*pOVar5->m_vi,(double *)line);
      ON_3dPointListRef::GetPoint
                ((ON_3dPointListRef *)local_68,**(uint **)(vlist.m_fP + 6),&(line->to).x);
      return uVar1;
    }
  }
  memcpy(line,&ON_Line::UnsetLine,0x30);
  return uVar1;
}

Assistant:

unsigned int ON_MeshComponentRef::GetMeshTopologyEdgeAndLine(
  const struct ON_MeshTopologyEdge*& tope,
  ON_Line& line 
  ) const
{
  tope = 0;
  unsigned int topei = GetMeshTopologyEdge(tope);
  if ( ON_UNSET_UINT_INDEX != topei && 0 != tope && tope->m_topvi[0] >= 0 && tope->m_topvi[1] >= 0 )
  {
    const ON_MeshTopology* top = MeshTopology();
    if ( 0 != top )
    {
      int topv_count = top->m_topv.Count();
      if ( tope->m_topvi[0] < topv_count && tope->m_topvi[1] < topv_count )
      {
        const ON_MeshTopologyVertex& v0 = top->m_topv[tope->m_topvi[0]];
        const ON_MeshTopologyVertex& v1 = top->m_topv[tope->m_topvi[1]];
        if ( v0.m_v_count > 0 && v1.m_v_count > 0 && 0 != v0.m_vi && 0 != v1.m_vi )
        {
          if ( v0.m_vi[0] >= 0 && v1.m_vi[0] >= 0 && v0.m_vi[0] < m_mesh->m_V.Count() && v1.m_vi[0] < m_mesh->m_V.Count() )
          {
            ON_3dPointListRef vlist(m_mesh);
            vlist.GetPoint(v0.m_vi[0],&line.from.x);
            vlist.GetPoint(v1.m_vi[0],&line.to.x);
            return topei;
          }
        }
      }
    }
  }

  line = ON_Line::UnsetLine;
  return topei;
}